

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

EventLogEntry * __thiscall
TTD::EventLog::RecordExternalCallEvent
          (EventLog *this,JavascriptFunction *func,int32 rootDepth,Arguments *args,
          bool checkExceptions)

{
  EventLogEntry *evt_00;
  EventLogEntry *evt;
  ExternalCallEventLogEntry *ecEvent;
  Arguments *pAStack_28;
  bool checkExceptions_local;
  Arguments *args_local;
  JavascriptFunction *pJStack_18;
  int32 rootDepth_local;
  JavascriptFunction *func_local;
  EventLog *this_local;
  
  evt = (EventLogEntry *)0x0;
  ecEvent._7_1_ = checkExceptions;
  pAStack_28 = args;
  args_local._4_4_ = rootDepth;
  pJStack_18 = func;
  func_local = (JavascriptFunction *)this;
  evt_00 = RecordGetInitializedEvent<TTD::NSLogEvents::ExternalCallEventLogEntry,(TTD::NSLogEvents::EventKind)12>
                     (this,(ExternalCallEventLogEntry **)&evt);
  evt_00->ResultStatus = 0;
  NSLogEvents::ExternalCallEventLogEntry_ProcessArgs
            (evt_00,args_local._4_4_,pJStack_18,pAStack_28,(bool)(ecEvent._7_1_ & 1),
             &this->m_eventSlabAllocator);
  NSLogEvents::ExternalCallEventLogEntry_ProcessDiagInfoPre
            (evt_00,pJStack_18,&this->m_eventSlabAllocator);
  return evt_00;
}

Assistant:

NSLogEvents::EventLogEntry* EventLog::RecordExternalCallEvent(Js::JavascriptFunction* func, int32 rootDepth, const Js::Arguments& args, bool checkExceptions)
    {
        NSLogEvents::ExternalCallEventLogEntry* ecEvent = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::ExternalCallEventLogEntry, NSLogEvents::EventKind::ExternalCallTag>(&ecEvent);

        //We never fail with an exception (instead we set the HasRecordedException in script context)
        evt->ResultStatus = 0;

        NSLogEvents::ExternalCallEventLogEntry_ProcessArgs(evt, rootDepth, func, args, checkExceptions, this->m_eventSlabAllocator);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
        NSLogEvents::ExternalCallEventLogEntry_ProcessDiagInfoPre(evt, func, this->m_eventSlabAllocator);
#endif

#if ENABLE_BASIC_TRACE || ENABLE_FULL_BC_TRACE
        this->m_threadContext->TTDExecutionInfo->GetTraceLogger()->WriteCall(func, true, args.Info.Count, args.Values, this->GetLastEventTime());
#endif

        return evt;
    }